

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Performance::anon_unknown_1::OperatorPerformanceCase::~OperatorPerformanceCase
          (OperatorPerformanceCase *this)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  pointer piVar3;
  int iVar4;
  undefined4 extraout_var;
  pointer puVar5;
  
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__OperatorPerformanceCase_02129ac8;
  puVar5 = (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar5 != (this->m_attribBuffers).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar4) + 0x438))
              ((ulong)((long)(this->m_attribBuffers).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->m_attribBuffers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    puVar5 = (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar5) {
      (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar5;
    }
  }
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->m_attribBuffers).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  std::
  vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>::
  ~vector(&this->m_programs);
  std::
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  ::~vector(&this->m_programData);
  pSVar2 = (this->m_initialCalibrationStorage).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_initialCalibrationStorage).m_ptr = (InitialCalibration *)0x0;
      (*((this->m_initialCalibrationStorage).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_initialCalibrationStorage).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->m_initialCalibrationStorage).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_initialCalibrationStorage).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  deqp::gls::TheilSenCalibrator::~TheilSenCalibrator(&this->m_calibrator);
  piVar3 = (this->m_highWorkloadSizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(this->m_highWorkloadSizes).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar3);
  }
  std::
  vector<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  ::~vector(&this->m_workloadRecords);
  std::
  vector<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  ::~vector(&this->m_workloadRecordsFindHigh);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

OperatorPerformanceCase::~OperatorPerformanceCase (void)
{
	if (!m_attribBuffers.empty())
	{
		m_renderCtx.getFunctions().deleteBuffers((glw::GLsizei)m_attribBuffers.size(), &m_attribBuffers[0]);
		m_attribBuffers.clear();
	}
}